

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O1

FT_UInt32 tt_cmap0_char_next(TT_CMap cmap,FT_UInt32 *pchar_code)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = *pchar_code;
  do {
    uVar2 = uVar2 + 1;
    if (0xff < uVar2) {
      uVar2 = 0;
      uVar1 = 0;
      break;
    }
    uVar1 = (uint)cmap->data[(ulong)uVar2 + 6];
  } while (cmap->data[(ulong)uVar2 + 6] == 0);
  *pchar_code = uVar2;
  return uVar1;
}

Assistant:

FT_CALLBACK_DEF( FT_UInt32 )
  tt_cmap0_char_next( TT_CMap     cmap,
                      FT_UInt32  *pchar_code )
  {
    FT_Byte*   table    = cmap->data;
    FT_UInt32  charcode = *pchar_code;
    FT_UInt32  result   = 0;
    FT_UInt    gindex   = 0;


    table += 6;  /* go to glyph IDs */
    while ( ++charcode < 256 )
    {
      gindex = table[charcode];
      if ( gindex != 0 )
      {
        result = charcode;
        break;
      }
    }

    *pchar_code = result;
    return gindex;
  }